

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O1

exr_result_t
DwaCompressor_uncompress
          (DwaCompressor *me,uint8_t *inPtr,uint64_t iSize,void *uncompressed_data,
          uint64_t uncompressed_size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  CompressorScheme CVar5;
  ulong in_bytes;
  ulong in_bytes_00;
  ulong out_bytes_avail;
  char *out_bytes_avail_00;
  ulong outsz;
  ulong nRaw;
  ulong uVar6;
  ulong uVar7;
  uint16_t *raw;
  exr_decode_pipeline_t *peVar8;
  ChannelData *pCVar9;
  CscChannelSet *pCVar10;
  exr_coding_channel_info_t *peVar11;
  char *pcVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  exr_result_t eVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  Classifier *__s;
  uint64_t uVar19;
  ulong uVar20;
  char cVar21;
  ulong uVar22;
  long lVar23;
  int *piVar24;
  ulong uVar25;
  int iVar26;
  uint8_t *puVar27;
  int iVar28;
  ushort *in;
  long lVar29;
  size_t __n;
  size_t sVar30;
  uint8_t *puVar31;
  uint uVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  size_t outBufferSize;
  Classifier tmpc;
  uint64_t readHere;
  uint8_t *tmpPtr;
  uint8_t *local_e0;
  uint8_t *local_b8;
  uint8_t *local_a0;
  LossyDctDecoder local_98;
  uint64_t local_40;
  uint8_t *local_38;
  
  if (iSize < 0x58) {
    return 0x17;
  }
  memset(uncompressed_data,0,uncompressed_size);
  uVar20 = *(ulong *)(inPtr + 0x28);
  if (iSize < uVar20) {
    return 0x17;
  }
  uVar25 = *(ulong *)(inPtr + 0x20);
  if (iSize < uVar25) {
    return 0x17;
  }
  in_bytes = *(ulong *)(inPtr + 0x18);
  if (iSize < in_bytes) {
    return 0x17;
  }
  in_bytes_00 = *(ulong *)(inPtr + 0x10);
  if (iSize < in_bytes_00) {
    return 0x17;
  }
  if (iSize < in_bytes_00 + in_bytes + uVar25 + uVar20 + 0x58) {
    return 0x17;
  }
  out_bytes_avail = *(ulong *)(inPtr + 8);
  out_bytes_avail_00 = *(char **)(inPtr + 0x30);
  outsz = *(ulong *)(inPtr + 0x38);
  nRaw = *(ulong *)(inPtr + 0x40);
  uVar6 = *(ulong *)(inPtr + 0x48);
  if ((long)(uVar20 | (ulong)out_bytes_avail_00 | outsz |
             in_bytes | uVar25 | in_bytes_00 | out_bytes_avail | nRaw | uVar6) < 0) {
    return 0x17;
  }
  uVar7 = *(ulong *)inPtr;
  lVar23 = *(long *)(inPtr + 0x50);
  in = (ushort *)(inPtr + 0x58);
  if (uVar7 < 2) {
    me->_channelRules = sLegacyChannelRules;
    me->_channelRuleCount = 0x19;
    eVar15 = 0;
  }
  else {
    eVar15 = 0x17;
    if (2 < iSize - 0x58) {
      uVar22 = (ulong)*in;
      eVar15 = 0x17;
      if (uVar22 <= iSize - 0x58 && 1 < uVar22) {
        local_a0 = inPtr + 0x5a;
        local_38 = local_a0;
        if (uVar22 == 2) {
          bVar33 = true;
          eVar15 = 0;
          sVar30 = 0;
        }
        else {
          sVar30 = 0;
          do {
            local_98._packedAcCount = 0;
            local_98._packedDcCount = 0;
            local_98._packedAc = (uint8_t *)0x0;
            local_98._packedAcEnd = (uint8_t *)0x0;
            local_40 = 0;
            eVar15 = Classifier_read((Classifier *)&local_98,&local_38,&local_40);
            uVar19 = local_40;
            if (((char *)local_98._0_8_ != (char *)0x0) && (local_98._packedAcEnd._5_1_ == '\0')) {
              internal_exr_free((void *)local_98._0_8_);
            }
            sVar30 = sVar30 + 1;
            bVar33 = eVar15 == 0;
          } while ((bVar33) && (uVar19 != 0));
        }
        in = (ushort *)((long)in + uVar22);
        if (bVar33) {
          me->_channelRuleCount = sVar30;
          __s = (Classifier *)internal_exr_alloc(sVar30 * 0x18);
          me->_channelRules = __s;
          if (__s == (Classifier *)0x0) {
            eVar15 = 1;
          }
          else {
            eVar15 = 0;
            memset(__s,0,sVar30 * 0x18);
            if (sVar30 != 0) {
              eVar15 = 0;
              lVar29 = 0;
              do {
                auVar13._8_8_ = 0;
                auVar13._0_8_ = local_98._packedAc;
                local_98._0_16_ = auVar13 << 0x40;
                Classifier_read((Classifier *)((long)&me->_channelRules->_suffix + lVar29),&local_a0
                                ,(uint64_t *)&local_98);
                lVar29 = lVar29 + 0x18;
                sVar30 = sVar30 - 1;
              } while (sVar30 != 0);
            }
          }
        }
      }
    }
  }
  if (eVar15 != 0) {
    return eVar15;
  }
  local_a0 = (uint8_t *)0x0;
  eVar15 = DwaCompressor_initializeBuffers(me,(size_t *)&local_a0);
  if (eVar15 != 0) {
    return eVar15;
  }
  puVar27 = (uint8_t *)me->_decode->unpacked_buffer;
  local_a0 = (uint8_t *)me->_decode->unpacked_alloc_size;
  uVar16 = 0x16;
  if (2 < uVar7) {
    return 0x16;
  }
  local_e0 = me->_packedAcBuffer;
  local_b8 = me->_packedDcBuffer;
  DwaCompressor_setupChannelData(me);
  if (in_bytes_00 != 0) {
    uVar16 = 0x17;
    if (me->_planarUncBufferSize[0] < out_bytes_avail) {
      return 0x17;
    }
    eVar15 = exr_uncompress_buffer
                       (in,in_bytes_00,me->_planarUncBuffer[0],out_bytes_avail,(size_t *)0x0);
    if (eVar15 != 0) {
      return 0x17;
    }
  }
  puVar31 = (uint8_t *)((long)in + in_bytes_00);
  if (in_bytes != 0) {
    raw = (uint16_t *)me->_packedAcBuffer;
    uVar16 = 0x17;
    if (raw == (uint16_t *)0x0) {
      return 0x17;
    }
    pcVar12 = (char *)(nRaw * 2);
    if ((char *)me->_packedAcBufferSize < pcVar12) {
      return 0x17;
    }
    if (lVar23 == 1) {
      eVar15 = exr_uncompress_buffer(puVar31,in_bytes,raw,(size_t)pcVar12,(size_t *)&local_98);
      uVar16 = 0x17;
      if (eVar15 != 0) {
        return eVar15;
      }
      if (pcVar12 != (char *)local_98._0_8_) {
        return 0x17;
      }
    }
    else {
      if (lVar23 != 0) {
        return 0x17;
      }
      peVar8 = me->_decode;
      eVar15 = internal_huf_decompress
                         (peVar8,puVar31,in_bytes,raw,nRaw,peVar8->scratch_buffer_1,
                          peVar8->scratch_alloc_size_1);
      if (eVar15 != 0) {
        return eVar15;
      }
    }
  }
  uVar17 = 0;
  if (uVar25 == 0) {
    if (uVar6 != 0) {
      return 0x17;
    }
    goto LAB_0010ae0e;
  }
  pcVar12 = (char *)(uVar6 * 2);
  if ((char *)me->_packedDcBufferSize < pcVar12) {
    bVar33 = false;
    uVar32 = 0x17;
  }
  else {
    peVar8 = me->_decode;
    uVar17 = internal_decode_alloc_buffer
                       (peVar8,EXR_TRANSCODE_BUFFER_SCRATCH1,&peVar8->scratch_buffer_1,
                        &peVar8->scratch_alloc_size_1,(size_t)pcVar12);
    uVar32 = uVar17;
    if (uVar17 == 0) {
      uVar17 = exr_uncompress_buffer
                         (puVar31 + in_bytes,uVar25,me->_decode->scratch_buffer_1,(size_t)pcVar12,
                          (size_t *)&local_98);
      bVar33 = false;
      uVar32 = 0x17;
      if (uVar17 == 0) {
        uVar32 = 0x17;
        if (pcVar12 == (char *)local_98._0_8_) {
          internal_zip_reconstruct_bytes
                    (me->_packedDcBuffer,(uint8_t *)me->_decode->scratch_buffer_1,(uint64_t)pcVar12)
          ;
          uVar17 = 0;
          bVar33 = true;
          uVar32 = uVar16;
        }
        goto LAB_0010ae03;
      }
    }
    bVar33 = false;
  }
LAB_0010ae03:
  uVar16 = uVar32;
  if (!bVar33) {
    return uVar16;
  }
LAB_0010ae0e:
  uVar32 = uVar16;
  if (outsz != 0) {
    if ((char *)me->_rleBufferSize < out_bytes_avail_00) {
      return 0x17;
    }
    if (me->_planarUncBufferSize[2] < outsz) {
      return 0x17;
    }
    eVar15 = exr_uncompress_buffer
                       (puVar31 + in_bytes + uVar25,uVar20,me->_rleBuffer,(size_t)out_bytes_avail_00
                        ,(size_t *)&local_98);
    uVar32 = 0x17;
    bVar33 = false;
    if ((eVar15 == 0) && (bVar33 = false, (char *)local_98._0_8_ == out_bytes_avail_00)) {
      uVar19 = internal_rle_decompress
                         (me->_planarUncBuffer[2],outsz,me->_rleBuffer,(uint64_t)out_bytes_avail_00)
      ;
      bVar33 = uVar19 == outsz;
      uVar32 = 0x17;
      if (bVar33) {
        uVar32 = uVar16;
      }
    }
    if (!bVar33) {
      return uVar32;
    }
  }
  auVar13 = _DAT_0012c0e0;
  lVar23 = (long)me->_numChannels;
  if (lVar23 != 0) {
    uVar20 = lVar23 + 3U & 0xfffffffffffffffc;
    lVar23 = lVar23 + -1;
    auVar36._8_4_ = (int)lVar23;
    auVar36._0_8_ = lVar23;
    auVar36._12_4_ = (int)((ulong)lVar23 >> 0x20);
    piVar24 = &me->_channelData[3].processed;
    auVar36 = auVar36 ^ _DAT_0012c0e0;
    auVar37 = _DAT_0012c0b0;
    auVar38 = _DAT_0012c0c0;
    do {
      auVar39 = auVar38 ^ auVar13;
      iVar26 = auVar36._4_4_;
      if ((bool)(~(auVar39._4_4_ == iVar26 && auVar36._0_4_ < auVar39._0_4_ ||
                  iVar26 < auVar39._4_4_) & 1)) {
        piVar24[-0x1b0] = 0;
      }
      if ((auVar39._12_4_ != auVar36._12_4_ || auVar39._8_4_ <= auVar36._8_4_) &&
          auVar39._12_4_ <= auVar36._12_4_) {
        piVar24[-0x120] = 0;
      }
      auVar39 = auVar37 ^ auVar13;
      iVar28 = auVar39._4_4_;
      if (iVar28 <= iVar26 && (iVar28 != iVar26 || auVar39._0_4_ <= auVar36._0_4_)) {
        piVar24[-0x90] = 0;
        *piVar24 = 0;
      }
      lVar23 = auVar38._8_8_;
      auVar38._0_8_ = auVar38._0_8_ + 4;
      auVar38._8_8_ = lVar23 + 4;
      lVar23 = auVar37._8_8_;
      auVar37._0_8_ = auVar37._0_8_ + 4;
      auVar37._8_8_ = lVar23 + 4;
      piVar24 = piVar24 + 0x240;
      uVar20 = uVar20 - 4;
    } while (uVar20 != 0);
  }
  iVar26 = me->_min[1];
  bVar33 = me->_max[1] < iVar26;
  if (iVar26 <= me->_max[1]) {
    do {
      bVar34 = me->_numChannels != 0;
      if (bVar34) {
        lVar23 = 0x20;
        uVar20 = 0;
        do {
          lVar29 = *(long *)((long)(me->_channelData->_dctData)._dctData + lVar23 + -0x40);
          cVar21 = '\v';
          if (iVar26 % *(int *)(lVar29 + 0x14) == 0) {
            eVar15 = DctCoderChannelData_push_row
                               ((DctCoderChannelData *)
                                ((long)(me->_channelData->_dctData)._dctData + lVar23 + -0x20),
                                puVar27);
            bVar35 = eVar15 == 0;
            if (bVar35) {
              puVar27 = puVar27 + (long)*(char *)(lVar29 + 0x19) * (long)*(int *)(lVar29 + 0xc);
            }
            else {
              uVar32 = 1;
            }
            cVar21 = !bVar35;
            uVar17 = (uint)!bVar35;
          }
          if ((cVar21 != '\v') && (cVar21 != '\0')) break;
          uVar20 = uVar20 + 1;
          lVar23 = lVar23 + 0x240;
          bVar34 = uVar20 < (ulong)(long)me->_numChannels;
        } while (bVar34);
      }
      if (bVar34) break;
      bVar33 = me->_max[1] <= iVar26;
      bVar34 = iVar26 < me->_max[1];
      iVar26 = iVar26 + 1;
    } while (bVar34);
  }
  uVar16 = uVar32;
  if (bVar33) {
    bVar33 = me->_numCscChannelSets != 0;
    if (bVar33) {
      lVar23 = 8;
      uVar20 = 0;
      do {
        pCVar9 = me->_channelData;
        pCVar10 = me->_cscChannelSets;
        iVar26 = *(int *)((long)pCVar10->idx + lVar23 + -8);
        if (((pCVar9[iVar26].compression == LOSSY_DCT) &&
            (iVar28 = *(int *)((long)pCVar10->idx + lVar23 + -4),
            pCVar9[iVar28].compression == LOSSY_DCT)) &&
           (iVar18 = *(int *)((long)pCVar10->idx + lVar23), pCVar9[iVar18].compression == LOSSY_DCT)
           ) {
          local_98._channel_decode_data[1] = &pCVar9[iVar28]._dctData;
          local_98._channel_decode_data[2] = &pCVar9[iVar18]._dctData;
          local_98._packedAcEnd = local_e0 + nRaw * 2;
          peVar11 = pCVar9[iVar26].chan;
          local_98._channel_decode_data[0] = &pCVar9[iVar26]._dctData;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = local_e0;
          local_98._0_16_ = auVar39 << 0x40;
          local_98._packedDc = local_b8;
          local_98._toLinear = dwaCompressorToLinear;
          uVar1 = peVar11->height;
          uVar3 = peVar11->width;
          local_98._height = uVar1;
          local_98._width = uVar3;
          local_98._channel_decode_data_count = 3;
          uVar16 = LossyDctDecoder_execute(&local_98);
          local_e0 = local_e0 + (long)local_98._packedAcCount * 2;
          local_b8 = local_b8 + (long)local_98._packedDcCount * 2;
          pCVar9 = me->_channelData;
          pCVar9[iVar26].processed = 1;
          pCVar9[iVar28].processed = 1;
          pCVar9[iVar18].processed = 1;
          uVar17 = 0;
          bVar34 = uVar16 == 0;
          if (!bVar34) {
            uVar17 = uVar16;
            uVar32 = uVar16;
          }
        }
        else {
          bVar34 = false;
          uVar32 = 0x17;
        }
        if (!bVar34) break;
        uVar20 = uVar20 + 1;
        lVar23 = lVar23 + 0xc;
        bVar33 = uVar20 < (ulong)(long)me->_numCscChannelSets;
      } while (bVar33);
    }
    uVar16 = uVar32;
    if ((!bVar33) && (uVar16 = uVar17, me->_numChannels != 0)) {
      lVar23 = 0x210;
      uVar20 = 0;
      do {
        pCVar9 = me->_channelData;
        iVar26 = 0x11;
        uVar16 = uVar32;
        if (pCVar9[uVar20].processed == 0) {
          peVar11 = pCVar9[uVar20].chan;
          cVar21 = peVar11->bytes_per_element;
          CVar5 = pCVar9[uVar20].compression;
          if (CVar5 == UNKNOWN) {
            iVar26 = me->_min[1];
            bVar33 = me->_max[1] < iVar26;
            if (iVar26 <= me->_max[1]) {
              __n = (long)(int)cVar21 * (long)peVar11->width;
              iVar28 = 0;
              do {
                if (iVar26 % peVar11->y_samples == 0) {
                  if (me->_planarUncBuffer[0] + me->_planarUncBufferSize[0] <
                      pCVar9[uVar20].planarUncBufferEnd + __n) {
                    uVar32 = 0x17;
                    iVar26 = 1;
                    goto LAB_0010b4ca;
                  }
                  memcpy(pCVar9[uVar20]._dctData._rows[iVar28],pCVar9[uVar20].planarUncBufferEnd,__n
                        );
                  pCVar9[uVar20].planarUncBufferEnd = pCVar9[uVar20].planarUncBufferEnd + __n;
                  iVar28 = iVar28 + 1;
                }
                bVar33 = me->_max[1] <= iVar26;
                bVar34 = iVar26 < me->_max[1];
                iVar26 = iVar26 + 1;
              } while (bVar34);
            }
            iVar26 = 0;
LAB_0010b4ca:
            uVar16 = uVar32;
            if (bVar33) goto LAB_0010b5c9;
          }
          else if (CVar5 == RLE) {
            if (me->_min[1] <= me->_max[1]) {
              iVar28 = 0;
              iVar26 = me->_min[1];
              do {
                if (iVar26 % peVar11->y_samples == 0) {
                  puVar27 = pCVar9[uVar20]._dctData._rows[iVar28];
                  if (cVar21 == '\x02') {
                    interleaveByte2(puVar27,pCVar9[uVar20].planarUncRleEnd[0],
                                    pCVar9[uVar20].planarUncRleEnd[1],peVar11->width);
                    iVar18 = peVar11->width;
                    pCVar9[uVar20].planarUncRleEnd[0] = pCVar9[uVar20].planarUncRleEnd[0] + iVar18;
                    pCVar9[uVar20].planarUncRleEnd[1] = pCVar9[uVar20].planarUncRleEnd[1] + iVar18;
                  }
                  else if (0 < peVar11->width) {
                    iVar18 = 0;
                    do {
                      if ('\0' < cVar21) {
                        uVar25 = 0;
                        do {
                          puVar31 = *(uint8_t **)
                                     ((long)(pCVar9->_dctData)._dctData +
                                     uVar25 * 8 + lVar23 + -0x20);
                          *(uint8_t **)
                           ((long)(pCVar9->_dctData)._dctData + uVar25 * 8 + lVar23 + -0x20) =
                               puVar31 + 1;
                          puVar27[uVar25] = *puVar31;
                          uVar25 = uVar25 + 1;
                        } while ((uint)(int)cVar21 != uVar25);
                        puVar27 = puVar27 + uVar25;
                      }
                      iVar18 = iVar18 + 1;
                    } while (iVar18 < peVar11->width);
                  }
                  iVar28 = iVar28 + 1;
                }
                bVar33 = iVar26 < me->_max[1];
                iVar26 = iVar26 + 1;
              } while (bVar33);
            }
LAB_0010b5c9:
            pCVar9[uVar20].processed = 1;
            iVar26 = 0;
            uVar16 = uVar32;
          }
          else {
            iVar26 = 1;
            if (CVar5 == LOSSY_DCT) {
              bVar33 = peVar11->p_linear == '\0';
              local_98._packedAcEnd = local_e0 + nRaw * 2;
              local_98._toLinear = (unsigned_short *)0x0;
              if (bVar33) {
                local_98._toLinear = dwaCompressorToLinear;
              }
              auVar14._8_8_ = 0;
              auVar14._0_8_ = local_e0;
              local_98._0_16_ = auVar14 << 0x40;
              local_98._packedDc = local_b8;
              uVar2 = peVar11->height;
              uVar4 = peVar11->width;
              local_98._height = uVar2;
              local_98._width = uVar4;
              if (!bVar33) {
                local_98._toLinear = dwaCompressorNoOp;
              }
              local_98._channel_decode_data[0] = &pCVar9[uVar20]._dctData;
              local_98._channel_decode_data[2] = (DctCoderChannelData *)0x0;
              local_98._channel_decode_data[1]._0_4_ = 0;
              local_98._channel_decode_data[1]._4_4_ = 0;
              local_98._channel_decode_data_count = 1;
              uVar17 = LossyDctDecoder_execute(&local_98);
              local_e0 = local_e0 + (long)local_98._packedAcCount * 2;
              local_b8 = local_b8 + (long)local_98._packedDcCount * 2;
              uVar16 = uVar17;
              if (uVar17 == 0) goto LAB_0010b5c9;
            }
            else {
              uVar16 = 0x17;
            }
          }
        }
        uVar32 = uVar16;
        if ((iVar26 != 0x11) && (iVar26 != 0)) {
          return uVar32;
        }
        uVar20 = uVar20 + 1;
        lVar23 = lVar23 + 0x240;
        uVar16 = uVar17;
      } while (uVar20 < (ulong)(long)me->_numChannels);
    }
  }
  return uVar16;
}

Assistant:

exr_result_t
DwaCompressor_uncompress (
    DwaCompressor* me,
    const uint8_t* inPtr,
    uint64_t       iSize,
    void*          uncompressed_data,
    uint64_t       uncompressed_size)
{
    uint64_t     headerSize = NUM_SIZES_SINGLE * sizeof (uint64_t);
    exr_result_t rv         = EXR_ERR_SUCCESS;

    if (iSize < headerSize)
    {
        return EXR_ERR_CORRUPT_CHUNK;
        //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
        //                               "(truncated header).");
    }

    //
    // Flip the counters from XDR to NATIVE
    //
    uint64_t counters[NUM_SIZES_SINGLE];

    memset (uncompressed_data, 0, uncompressed_size);

    memcpy (counters, inPtr, headerSize);
    priv_to_native64 (counters, NUM_SIZES_SINGLE);

    //
    // Unwind all the counter info
    //
    uint64_t version                 = counters[VERSION];
    uint64_t unknownUncompressedSize = counters[UNKNOWN_UNCOMPRESSED_SIZE];
    uint64_t unknownCompressedSize   = counters[UNKNOWN_COMPRESSED_SIZE];
    uint64_t acCompressedSize        = counters[AC_COMPRESSED_SIZE];
    uint64_t dcCompressedSize        = counters[DC_COMPRESSED_SIZE];
    uint64_t rleCompressedSize       = counters[RLE_COMPRESSED_SIZE];
    uint64_t rleUncompressedSize     = counters[RLE_UNCOMPRESSED_SIZE];
    uint64_t rleRawSize              = counters[RLE_RAW_SIZE];

    uint64_t totalAcUncompressedCount = counters[AC_UNCOMPRESSED_COUNT];
    uint64_t totalDcUncompressedCount = counters[DC_UNCOMPRESSED_COUNT];

    uint64_t acCompression = counters[AC_COMPRESSION];

    uint64_t compressedSize = unknownCompressedSize + acCompressedSize +
                              dcCompressedSize + rleCompressedSize;

    const uint8_t* dataPtr  = inPtr + headerSize;
    uint64_t       dataLeft = iSize - headerSize;

    /* Both the sum and individual sizes are checked in case of overflow. */
    if (iSize < (headerSize + compressedSize) ||
        iSize < unknownCompressedSize || iSize < acCompressedSize ||
        iSize < dcCompressedSize || iSize < rleCompressedSize)
    {
        return EXR_ERR_CORRUPT_CHUNK;
        //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
        //                               "(truncated file).");
    }

    if ((int64_t) unknownUncompressedSize < 0 ||
        (int64_t) unknownCompressedSize < 0 || (int64_t) acCompressedSize < 0 ||
        (int64_t) dcCompressedSize < 0 || (int64_t) rleCompressedSize < 0 ||
        (int64_t) rleUncompressedSize < 0 || (int64_t) rleRawSize < 0 ||
        (int64_t) totalAcUncompressedCount < 0 ||
        (int64_t) totalDcUncompressedCount < 0)
    {
        return EXR_ERR_CORRUPT_CHUNK;
        //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
        //                               " (corrupt header).");
    }

    if (version < 2)
    {
        me->_channelRules = sLegacyChannelRules;
        me->_channelRuleCount =
            sizeof (sLegacyChannelRules) / sizeof (Classifier);
    }
    else
    {
        uint64_t ruleSize;
        rv =
            DwaCompressor_readChannelRules (me, &dataPtr, &dataLeft, &ruleSize);

        headerSize += ruleSize;
    }

    if (rv != EXR_ERR_SUCCESS) return rv;

    size_t outBufferSize = 0;
    rv                   = DwaCompressor_initializeBuffers (me, &outBufferSize);
    if (rv != EXR_ERR_SUCCESS) return rv;

    //
    // Allocate _outBuffer, if we haven't done so already
    //

    // the C++ classes used to have one buffer size for compress / uncompress
    // but here we want to do zero-ish copy...
    uint8_t* outBufferEnd = (uint8_t*) me->_decode->unpacked_buffer;
    //if (outBufferSize > me->_decode->unpacked_alloc_size)
    //{
    //    printf( "outbuffersize %lu larger than unpacked size %lu\n", outBufferSize, me->_decode->unpacked_alloc_size );
    //    return EXR_ERR_OUT_OF_MEMORY;
    //}
    outBufferSize = me->_decode->unpacked_alloc_size;

    //
    // Find the start of the RLE packed AC components and
    // the DC components for each channel. This will be handy
    // if you want to decode the channels in parallel later on.
    //

    uint8_t* packedAcBufferEnd = 0;

    if (me->_packedAcBuffer) packedAcBufferEnd = me->_packedAcBuffer;

    uint8_t* packedDcBufferEnd = 0;

    if (me->_packedDcBuffer) packedDcBufferEnd = me->_packedDcBuffer;

    //
    // UNKNOWN data is packed first, followed by the
    // Huffman-compressed AC, then the DC values,
    // and then the zlib compressed RLE data.
    //

    const uint8_t* compressedUnknownBuf = dataPtr;

    const uint8_t* compressedAcBuf =
        compressedUnknownBuf + (ptrdiff_t) (unknownCompressedSize);
    const uint8_t* compressedDcBuf =
        compressedAcBuf + (ptrdiff_t) (acCompressedSize);
    const uint8_t* compressedRleBuf =
        compressedDcBuf + (ptrdiff_t) (dcCompressedSize);

    //
    // Sanity check that the version is something we expect. Right now,
    // we can decode version 0, 1, and 2. v1 adds 'end of block' symbols
    // to the AC RLE. v2 adds channel classification rules at the
    // start of the data block.
    //

    if (version > 2)
    {
        return EXR_ERR_BAD_CHUNK_LEADER;
        //throw IEX_NAMESPACE::InputExc (
        //    "Invalid version of compressed data block");
    }

    rv = DwaCompressor_setupChannelData (me);

    //
    // Uncompress the UNKNOWN data into _planarUncBuffer[UNKNOWN]
    //

    if (unknownCompressedSize > 0)
    {
        if (unknownUncompressedSize > me->_planarUncBufferSize[UNKNOWN])
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
            //                               "(corrupt header).");
        }

        if (EXR_ERR_SUCCESS != exr_uncompress_buffer (
                                   compressedUnknownBuf,
                                   unknownCompressedSize,
                                   me->_planarUncBuffer[UNKNOWN],
                                   unknownUncompressedSize,
                                   NULL))
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("Error uncompressing UNKNOWN data.");
        }
    }

    //
    // Uncompress the AC data into _packedAcBuffer
    //

    if (acCompressedSize > 0)
    {
        if (!me->_packedAcBuffer ||
            totalAcUncompressedCount * sizeof (uint16_t) >
                me->_packedAcBufferSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
            //                               "(corrupt header).");
        }

        //
        // Don't trust the user to get it right, look in the file.
        //

        switch (acCompression)
        {
            case STATIC_HUFFMAN:
                rv = internal_huf_decompress (
                    me->_decode,
                    compressedAcBuf,
                    acCompressedSize,
                    (uint16_t*) me->_packedAcBuffer,
                    totalAcUncompressedCount,
                    me->_decode->scratch_buffer_1,
                    me->_decode->scratch_alloc_size_1);
                if (rv != EXR_ERR_SUCCESS) { return rv; }
                break;

            case DEFLATE: {
                size_t destLen;

                rv = exr_uncompress_buffer (
                    compressedAcBuf,
                    acCompressedSize,
                    me->_packedAcBuffer,
                    totalAcUncompressedCount * sizeof (uint16_t),
                    &destLen);
                if (rv != EXR_ERR_SUCCESS)
                {
                    return rv;
                    //throw IEX_NAMESPACE::InputExc (
                    //    "Data decompression (zlib) failed.");
                }

                if (totalAcUncompressedCount * sizeof (uint16_t) != destLen)
                {
                    return EXR_ERR_CORRUPT_CHUNK;
                    //throw IEX_NAMESPACE::InputExc ("AC data corrupt.");
                }
            }
            break;

            default:
                return EXR_ERR_CORRUPT_CHUNK;
                //throw IEX_NAMESPACE::NoImplExc ("Unknown AC Compression");
                break;
        }
    }

    //
    // Uncompress the DC data into _packedDcBuffer
    //

    if (dcCompressedSize > 0)
    {
        size_t destLen;
        size_t uncompBytes = totalDcUncompressedCount * sizeof (uint16_t);
        if (uncompBytes > me->_packedDcBufferSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
            //                               "(corrupt header).");
        }

        rv = internal_decode_alloc_buffer (
            me->_decode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(me->_decode->scratch_buffer_1),
            &(me->_decode->scratch_alloc_size_1),
            uncompBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        rv = exr_uncompress_buffer (
            compressedDcBuf,
            dcCompressedSize,
            me->_decode->scratch_buffer_1,
            uncompBytes,
            &destLen);
        if (rv != EXR_ERR_SUCCESS || (uncompBytes != destLen))
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("DC data corrupt.");
        }

        internal_zip_reconstruct_bytes (
            me->_packedDcBuffer, (uint8_t*) me->_decode->scratch_buffer_1, uncompBytes);
    }
    else
    {
        // if the compressed size is 0, then the uncompressed size must also be zero
        if (totalDcUncompressedCount != 0)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("DC data corrupt.");
        }
    }

    //
    // Uncompress the RLE data into _rleBuffer, then unRLE the results
    // into _planarUncBuffer[RLE]
    //

    if (rleRawSize > 0)
    {
        if (rleUncompressedSize > me->_rleBufferSize ||
            rleRawSize > me->_planarUncBufferSize[RLE])
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::InputExc ("Error uncompressing DWA data"
            //                               "(corrupt header).");
        }

        size_t dstLen;

        if (EXR_ERR_SUCCESS != exr_uncompress_buffer (
                                   compressedRleBuf,
                                   rleCompressedSize,
                                   me->_rleBuffer,
                                   rleUncompressedSize,
                                   &dstLen))
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("Error uncompressing RLE data.");
        }

        if (dstLen != rleUncompressedSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("RLE data corrupted");
        }

        if (internal_rle_decompress (
                me->_planarUncBuffer[RLE],
                rleRawSize,
                (const uint8_t*) me->_rleBuffer,
                rleUncompressedSize) != rleRawSize)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("RLE data corrupted");
        }
    }

    //
    // Determine the start of each row in the output buffer
    //
    for (size_t c = 0; c < me->_numChannels; ++c)
    {
        me->_channelData[c].processed = 0;
    }

    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
    {
        for (size_t c = 0; c < me->_numChannels; ++c)
        {
            ChannelData*               cd   = &(me->_channelData[c]);
            exr_coding_channel_info_t* chan = cd->chan;

            if ((y % chan->y_samples) != 0) continue;

            rv = DctCoderChannelData_push_row (&(cd->_dctData), outBufferEnd);
            if (rv != EXR_ERR_SUCCESS) return rv;

            outBufferEnd += chan->width * chan->bytes_per_element;
        }
    }

    //
    // Setup to decode each block of 3 channels that need to
    // be handled together
    //

    for (size_t csc = 0; csc < me->_numCscChannelSets; ++csc)
    {
        LossyDctDecoder decoder;
        CscChannelSet*  cset = &(me->_cscChannelSets[csc]);

        int rChan = cset->idx[0];
        int gChan = cset->idx[1];
        int bChan = cset->idx[2];

        if (me->_channelData[rChan].compression != LOSSY_DCT ||
            me->_channelData[gChan].compression != LOSSY_DCT ||
            me->_channelData[bChan].compression != LOSSY_DCT)
        {
            return EXR_ERR_CORRUPT_CHUNK;
            //throw IEX_NAMESPACE::BaseExc ("Bad DWA compression type detected");
        }

        rv = LossyDctDecoderCsc_construct (
            &decoder,
            &(me->_channelData[rChan]._dctData),
            &(me->_channelData[gChan]._dctData),
            &(me->_channelData[bChan]._dctData),
            packedAcBufferEnd,
            packedAcBufferEnd + totalAcUncompressedCount * sizeof (uint16_t),
            packedDcBufferEnd,
            dwaCompressorToLinear,
            me->_channelData[rChan].chan->width,
            me->_channelData[rChan].chan->height);

        if (rv == EXR_ERR_SUCCESS) rv = LossyDctDecoder_execute (&decoder);

        packedAcBufferEnd += decoder._packedAcCount * sizeof (uint16_t);

        packedDcBufferEnd += decoder._packedDcCount * sizeof (uint16_t);

        me->_channelData[rChan].processed = 1;
        me->_channelData[gChan].processed = 1;
        me->_channelData[bChan].processed = 1;

        LossyDctDecoder_destroy (&decoder);
        if (rv != EXR_ERR_SUCCESS) { return rv; }
    }

    //
    // Setup to handle the remaining channels by themselves
    //

    for (size_t c = 0; c < me->_numChannels; ++c)
    {
        ChannelData*               cd      = &(me->_channelData[c]);
        exr_coding_channel_info_t* chan    = cd->chan;
        DctCoderChannelData*       dcddata = &(cd->_dctData);

        if (cd->processed) continue;

        int pixelSize = chan->bytes_per_element;

        switch (cd->compression)
        {
            case LOSSY_DCT:

                //
                // Setup a single-channel lossy DCT decoder pointing
                // at the output buffer
                //

                {
                    const uint16_t* linearLut = NULL;
                    LossyDctDecoder decoder;

                    if (!chan->p_linear) linearLut = dwaCompressorToLinear;

                    rv = LossyDctDecoder_construct (
                        &decoder,
                        dcddata,
                        packedAcBufferEnd,
                        packedAcBufferEnd +
                            totalAcUncompressedCount * sizeof (uint16_t),
                        packedDcBufferEnd,
                        linearLut,
                        chan->width,
                        chan->height);

                    if (rv == EXR_ERR_SUCCESS)
                        rv = LossyDctDecoder_execute (&decoder);

                    packedAcBufferEnd +=
                        decoder._packedAcCount * sizeof (uint16_t);

                    packedDcBufferEnd +=
                        decoder._packedDcCount * sizeof (uint16_t);

                    LossyDctDecoder_destroy (&decoder);
                    if (rv != EXR_ERR_SUCCESS) { return rv; }
                }

                break;

            case RLE:

                //
                // For the RLE case, the data has been un-RLE'd into
                // planarUncRleEnd[], but is still split out by bytes.
                // We need to rearrange the bytes back into the correct
                // order in the output buffer;
                //

                {
                    int row = 0;

                    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
                    {
                        if ((y % chan->y_samples) != 0) continue;

                        uint8_t* dst = dcddata->_rows[row];

                        if (pixelSize == 2)
                        {
                            interleaveByte2 (
                                dst,
                                cd->planarUncRleEnd[0],
                                cd->planarUncRleEnd[1],
                                chan->width);

                            cd->planarUncRleEnd[0] += chan->width;
                            cd->planarUncRleEnd[1] += chan->width;
                        }
                        else
                        {
                            for (int x = 0; x < chan->width; ++x)
                            {
                                for (int byte = 0; byte < pixelSize; ++byte)
                                {
                                    *dst++ = *cd->planarUncRleEnd[byte]++;
                                }
                            }
                        }

                        row++;
                    }
                }

                break;

            case UNKNOWN:

                //
                // In the UNKNOWN case, data is already in planarUncBufferEnd
                // and just needs to copied over to the output buffer
                //

                {
                    int row             = 0;
                    int dstScanlineSize = chan->width * pixelSize;

                    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
                    {
                        if ((y % chan->y_samples) != 0) continue;

                        //
                        // sanity check for buffer data lying within range
                        //
                        if ((cd->planarUncBufferEnd +
                             (size_t) (dstScanlineSize)) >
                            (me->_planarUncBuffer[UNKNOWN] +
                             me->_planarUncBufferSize[UNKNOWN]))
                        {
                            return EXR_ERR_CORRUPT_CHUNK;
                            //throw IEX_NAMESPACE::InputExc ("DWA data corrupt");
                        }

                        memcpy (
                            dcddata->_rows[row],
                            cd->planarUncBufferEnd,
                            dstScanlineSize);

                        cd->planarUncBufferEnd += dstScanlineSize;
                        row++;
                    }
                }

                break;

            default:
                return EXR_ERR_CORRUPT_CHUNK;
                //throw IEX_NAMESPACE::NoImplExc (
                //    "Unhandled compression scheme case");
                break;
        }

        cd->processed = 1;
    }

    return rv;
}